

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

domain_type * __thiscall cs::domain_type::add_var(domain_type *this,var_id *id,var *val)

{
  bool bVar1;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  size_type sVar3;
  MappedReference<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_unsigned_long>_>
  puVar4;
  any *in_RDX;
  long in_RSI;
  domain_type *in_RDI;
  shared_ptr<cs::domain_ref> *in_stack_ffffffffffffffa8;
  shared_ptr<cs::domain_ref> *in_stack_ffffffffffffffb0;
  key_arg<std::__cxx11::basic_string<char>_> *in_stack_ffffffffffffffb8;
  key_arg<std::__cxx11::basic_string<char>_> *in_stack_ffffffffffffffc8;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_stack_ffffffffffffffd0;
  
  sVar2 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
          ::count<std::__cxx11::string>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (sVar2 == 0) {
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::push_back
              ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_RDI,
               (value_type *)in_stack_ffffffffffffffb8);
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x20);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(&in_RDI->m_slot);
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::
    emplace<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_long,_0>
              ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                *)in_RDI,args,(unsigned_long *)in_stack_ffffffffffffffb0);
    sVar3 = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(&in_RDI->m_slot);
    *(size_type *)(in_RSI + 8) = sVar3 - 1;
    std::shared_ptr<cs::domain_ref>::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else {
    bVar1 = std::operator!=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (bVar1) {
      puVar4 = phmap::priv::
               raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
               ::
               operator[]<std::__cxx11::string,phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>>
                         ((raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                           *)in_RDI,in_stack_ffffffffffffffb8);
      *(unsigned_long *)(in_RSI + 8) = *puVar4;
      std::shared_ptr<cs::domain_ref>::operator=
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[]
              (&in_RDI->m_slot,*(size_type *)(in_RSI + 8));
    cs_impl::any::operator=(in_RDX,(any *)in_stack_ffffffffffffffa8);
  }
  return in_RDI;
}

Assistant:

domain_type &add_var(const var_id &id, const var &val)
		{
			if (m_reflect.count(id.m_id) == 0) {
				m_slot.push_back(val);
				m_reflect.emplace(id.m_id, m_slot.size() - 1);
				id.m_slot_id = m_slot.size() - 1;
				id.m_ref = m_ref;
			}
			else {
				if (id.m_ref != m_ref) {
					id.m_slot_id = m_reflect[id.m_id];
					id.m_ref = m_ref;
				}
				m_slot[id.m_slot_id] = val;
			}
			return *this;
		}